

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

sexp sexp_bignum_quot_rem(sexp ctx,sexp_conflict *rem,sexp a,sexp b)

{
  void *pvVar1;
  sexp_conflict psVar2;
  long lVar3;
  sexp psVar4;
  sexp_uint_t sVar5;
  sexp psVar6;
  sexp_sint_t sVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  byte bVar12;
  long lVar13;
  long lVar14;
  undefined1 auVar15 [16];
  sexp a1;
  sexp b1;
  sexp x;
  sexp y;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_gc_var_t __sexp_gc_preserver5;
  sexp_gc_var_t __sexp_gc_preserver4;
  sexp_gc_var_t __sexp_gc_preserver3;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp local_118;
  sexp local_110;
  sexp local_108;
  sexp local_100;
  sexp local_f8;
  sexp local_f0;
  long local_e8;
  sexp local_e0;
  sexp_conflict *local_d8;
  sexp_uint_t local_d0;
  ulong local_c8;
  ulong local_c0;
  sexp local_b8;
  sexp local_b0;
  sexp_gc_var_t local_a8;
  sexp local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  sexp_gc_var_t local_78;
  sexp_gc_var_t local_68;
  sexp_gc_var_t local_58;
  sexp_gc_var_t local_48;
  
  local_100 = (sexp)&(b->value).type.slots;
  sVar5 = (b->value).string.offset;
  do {
    local_d0 = sVar5;
    if (local_d0 == 1) {
      local_d0 = 1;
      break;
    }
    sVar5 = local_d0 - 1;
  } while (*(long *)((long)&b->value + local_d0 * 8 + 8) == 0);
  local_110 = (sexp)0x43e;
  local_a8.var = (sexp_conflict *)0x0;
  local_a8.next = (sexp_gc_var_t *)0x0;
  local_f8 = (sexp)0x43e;
  local_48.var = (sexp_conflict *)0x0;
  local_48.next = (sexp_gc_var_t *)0x0;
  local_b0 = (sexp)&DAT_0000043e;
  local_58.var = (sexp_conflict *)0x0;
  local_58.next = (sexp_gc_var_t *)0x0;
  local_118 = (sexp)0x43e;
  local_68.var = (sexp_conflict *)0x0;
  local_68.next = (sexp_gc_var_t *)0x0;
  local_108 = (sexp)0x43e;
  local_78.var = (sexp_conflict *)0x0;
  local_78.next = (sexp_gc_var_t *)0x0;
  if ((local_d0 == 1) && (*(sexp *)local_100 == (sexp)0x0)) {
    psVar4 = sexp_xtype_exception(ctx,(sexp)0x0,"divide by zero",a);
    return psVar4;
  }
  local_a8.var = &local_110;
  local_48.next = &local_a8;
  local_a8.next = (ctx->value).context.saves;
  (ctx->value).context.saves = local_48.next;
  local_48.var = &local_f8;
  local_58.next = &local_48;
  (ctx->value).context.saves = local_58.next;
  local_58.var = &local_b0;
  local_68.next = &local_58;
  (ctx->value).context.saves = local_68.next;
  local_78.next = &local_68;
  (ctx->value).context.saves = local_78.next;
  local_78.var = &local_108;
  (ctx->value).context.saves = &local_78;
  uVar8 = (a->value).string.offset;
  local_e0 = b;
  local_d8 = rem;
  local_68.var = &local_118;
  psVar4 = sexp_alloc_tagged_aux(ctx,uVar8 * 8 + 0x18,0xc);
  (psVar4->value).string.offset = uVar8;
  uVar11 = (a->value).string.offset;
  uVar9 = uVar8;
  if (uVar11 < uVar8) {
    uVar9 = uVar11;
  }
  (psVar4->value).flonum_bits[0] = (a->value).flonum_bits[0];
  pvVar1 = (void *)((long)&psVar4->value + 0x10);
  memset(pvVar1,0,uVar8 * 8);
  memmove(pvVar1,(void *)((long)&a->value + 0x10),uVar9 << 3);
  psVar6 = local_e0;
  (psVar4->value).flonum_bits[0] = '\x01';
  local_118 = psVar4;
  if (local_d0 == 1) {
    psVar6 = ctx;
    local_108 = sexp_alloc_tagged_aux(ctx,0x20,0xc);
    psVar4 = local_e0;
    if ((((ulong)local_108 & 3) != 0) || (local_108->tag != 0x13)) {
      (local_108->value).string.offset = 1;
      (local_108->value).flonum_bits[0] = '\x01';
    }
    sVar5 = sexp_bignum_fxdiv(psVar6,local_118,(local_e0->value).string.length,0);
    (local_108->value).string.length = sVar5;
    psVar6 = sexp_bignum_normalize(local_108);
    *local_d8 = psVar6;
    if ((int)(psVar4->value).flonum_bits[0] * (int)(a->value).flonum_bits[0] < 0) {
      if ((((ulong)local_118 & 3) == 0) && (local_118->tag == 0xc)) {
        (local_118->value).flonum_bits[0] = -(local_118->value).flonum_bits[0];
      }
      else if (((ulong)local_118 & 1) != 0) {
        local_118 = (sexp)(1 - ((ulong)local_118 & 0xfffffffffffffffe));
      }
    }
    if ((a->value).flonum_bits[0] < '\0') {
      psVar2 = *local_d8;
      if ((((ulong)psVar2 & 3) == 0) && (psVar2->tag == 0xc)) {
        (psVar2->value).flonum_bits[0] = -(psVar2->value).flonum_bits[0];
      }
      else if (((ulong)psVar2 & 1) != 0) {
        *local_d8 = (sexp_conflict)(1 - ((ulong)psVar2 & 0xfffffffffffffffe));
      }
    }
    (ctx->value).context.saves = local_a8.next;
  }
  else {
    uVar8 = (local_e0->value).string.offset;
    psVar4 = sexp_alloc_tagged_aux(ctx,uVar8 * 8 + 0x18,0xc);
    (psVar4->value).string.offset = uVar8;
    uVar11 = (psVar6->value).string.offset;
    uVar9 = uVar8;
    if (uVar11 < uVar8) {
      uVar9 = uVar11;
    }
    (psVar4->value).flonum_bits[0] = (psVar6->value).flonum_bits[0];
    pvVar1 = (void *)((long)&psVar4->value + 0x10);
    memset(pvVar1,0,uVar8 * 8);
    memmove(pvVar1,local_100,uVar9 << 3);
    (psVar4->value).flonum_bits[0] = '\x01';
    local_110 = (sexp)&DAT_00000001;
    local_108 = psVar4;
    local_98 = a;
    local_f8 = sexp_make_bignum(ctx,(a->value).string.offset);
    psVar6 = local_108;
    psVar4 = local_118;
    sVar7 = sexp_bignum_compare_abs(local_118,local_108);
    if (sVar7 < 0) {
      bVar12 = 0;
    }
    else {
      lVar13 = 1;
      lVar10 = 0;
      local_f0 = ctx;
      do {
        lVar3 = (psVar4->value).fileno.fd;
        do {
          lVar14 = lVar3;
          if (lVar14 == 1) {
            lVar14 = 1;
            break;
          }
          lVar3 = lVar14 + -1;
        } while (*(long *)((long)&psVar4->value + lVar14 * 8 + 8) == 0);
        *(undefined8 *)((long)&local_f8->value + lVar10 * 8 + 0x10) = 0;
        if (0 < lVar10) {
          *(undefined8 *)((long)&local_f8->value + lVar10 * 8 + 8) = 0;
        }
        local_c0 = *(ulong *)((long)&psVar4->value + lVar14 * 8);
        local_88 = *(ulong *)((long)&psVar4->value + lVar14 * 8 + 8);
        local_90 = *(ulong *)((long)&psVar6->value + local_d0 * 8);
        local_c8 = *(ulong *)((long)&psVar6->value + local_d0 * 8 + 8);
        local_b8 = local_f8;
        local_80 = local_c8;
        uVar8 = local_88;
        uVar11 = local_90;
        uVar9 = local_c0;
        if ((((2 < (long)local_d0) && (2 < lVar14)) && (local_88 >> 0x20 == 0)) &&
           (local_c8 >> 0x20 == 0)) {
          local_80 = local_c8 << 0x20 | local_90 >> 0x20;
          uVar8 = local_88 << 0x20 | local_c0 >> 0x20;
          uVar11 = (ulong)*(uint *)(&psVar6->markedp + local_d0 * 8) | local_90 << 0x20;
          uVar9 = (ulong)*(uint *)(&psVar4->markedp + lVar14 * 8) | local_c0 << 0x20;
        }
        lVar10 = lVar14 - local_d0;
        local_100 = psVar6;
        local_e8 = lVar13;
        auVar15 = __udivti3(uVar9,uVar8,uVar11);
        lVar13 = local_e8;
        ctx = local_f0;
        psVar6 = local_100;
        if (uVar8 < local_80 || uVar8 - local_80 < (ulong)(uVar9 < uVar11)) {
          uVar8 = local_c8;
          uVar11 = local_88;
          uVar9 = local_c0;
          if ((local_88 >> 0x20 == 0) && (local_c8 >> 0x20 == 0)) {
            uVar8 = local_c8 << 0x20 | local_90 >> 0x20;
            uVar11 = local_88 << 0x20 | local_c0 >> 0x20;
            uVar9 = local_c0 << 0x20 | (ulong)*(uint *)(&psVar4->markedp + lVar14 * 8);
          }
          auVar15 = __udivti3(uVar9,uVar11,uVar8,0);
        }
        else {
          lVar10 = lVar10 + 1;
        }
        *(long *)((long)&local_b8->value + lVar10 * 8 + 0x10) = auVar15._8_8_;
        if (0 < lVar10) {
          *(long *)((long)&local_b8->value + lVar10 * 8 + 8) = auVar15._0_8_;
        }
        local_b0 = sexp_bignum_mul(ctx,(sexp)0x0,psVar6,local_b8);
        if (lVar13 < 0) {
          local_118 = sexp_bignum_add(ctx,(sexp)0x0,local_118,local_b0);
          local_110 = sexp_sub(ctx,local_110,local_f8);
        }
        else {
          local_118 = sexp_bignum_sub(ctx,(sexp)0x0,local_118,local_b0);
          local_110 = sexp_add(ctx,local_110,local_f8);
        }
        psVar6 = local_108;
        psVar4 = local_118;
        if (lVar13 != (local_118->value).flonum_bits[0]) {
          (local_118->value).flonum_bits[0] = -(char)lVar13;
          lVar13 = -lVar13;
        }
        sVar7 = sexp_bignum_compare_abs(local_118,local_108);
      } while (-1 < sVar7);
      bVar12 = (byte)((ulong)lVar13 >> 0x3f);
    }
    local_118 = sexp_bignum_normalize(psVar4);
    if ((local_118 != (sexp)&DAT_00000001 & bVar12) == 1) {
      local_110 = sexp_sub(ctx,local_110,(sexp)&DAT_00000003);
      local_118 = sexp_add(ctx,local_118,local_108);
    }
    *local_d8 = local_118;
    if ((int)(local_e0->value).flonum_bits[0] * (int)(local_98->value).flonum_bits[0] < 0) {
      if ((((ulong)local_110 & 3) == 0) && (local_110->tag == 0xc)) {
        (local_110->value).flonum_bits[0] = -(local_110->value).flonum_bits[0];
      }
      else if (((ulong)local_110 & 1) != 0) {
        local_110 = (sexp)(1 - ((ulong)local_110 & 0xfffffffffffffffe));
      }
    }
    if ((local_98->value).flonum_bits[0] < '\0') {
      psVar2 = *local_d8;
      if ((((ulong)psVar2 & 3) == 0) && (psVar2->tag == 0xc)) {
        (psVar2->value).flonum_bits[0] = -(psVar2->value).flonum_bits[0];
      }
      else if (((ulong)psVar2 & 1) != 0) {
        *local_d8 = (sexp_conflict)(1 - ((ulong)psVar2 & 0xfffffffffffffffe));
      }
    }
    (ctx->value).context.saves = local_a8.next;
    local_118 = local_110;
  }
  return local_118;
}

Assistant:

sexp sexp_bignum_quot_rem (sexp ctx, sexp *rem, sexp a, sexp b) {
  sexp_luint_t d, dn, dd;
  sexp_uint_t dlo, dhi;
  sexp_sint_t alen, blen=sexp_bignum_hi(b), sign=1, off=0;
  sexp_gc_var5(q, x, y, a1, b1);
  if (blen == 1 && sexp_bignum_data(b)[0] == 0)
    return sexp_xtype_exception(ctx, NULL, "divide by zero", a);
  sexp_gc_preserve5(ctx, q, x, y, a1, b1);
  a1 = sexp_copy_bignum(ctx, NULL, a, 0);
  sexp_bignum_sign(a1) = 1;
  /* fast path for single bigit divisor */
  if (blen == 1) {
    b1 = sexp_make_bignum(ctx, 1);
    sexp_bignum_data(b1)[0] = sexp_bignum_fxdiv(ctx, a1, sexp_bignum_data(b)[0], 0);
    *rem = sexp_bignum_normalize(b1);
    if (sexp_bignum_sign(a) * sexp_bignum_sign(b) < 0) {
      sexp_negate_exact(a1);
    }
    if (sexp_bignum_sign(a) < 0) {
      sexp_negate_exact(*rem);
    }
    sexp_gc_release5(ctx);
    return a1;
  }
  /* general case */
  b1 = sexp_copy_bignum(ctx, NULL, b, 0);
  sexp_bignum_sign(b1) = 1;
  q = SEXP_ZERO;
  x = sexp_make_bignum(ctx, sexp_bignum_length(a));
  while (sexp_bignum_compare_abs(a1, b1) >= 0) { /* a1, b1 at least 2 bigits */
    /* guess divisor x */
    alen = sexp_bignum_hi(a1);
    sexp_bignum_data(x)[off] = 0;
    if (off > 0) sexp_bignum_data(x)[off-1] = 0;
    off = alen - blen + 1;
    dn = luint_add_uint(luint_shl(luint_from_uint(sexp_bignum_data(a1)[alen-1])
           , (sizeof(sexp_uint_t)*8))
          , sexp_bignum_data(a1)[alen-2]);
    dd = luint_add_uint(luint_shl(luint_from_uint(sexp_bignum_data(b1)[blen-1])
           , (sizeof(sexp_uint_t)*8))
          , sexp_bignum_data(b1)[blen-2]);
    if (alen > 2 && blen > 2 &&
        luint_lt(luint_from_uint(sexp_bignum_data(a1)[alen-1]), luint_shl(luint_from_uint(1), (sizeof(sexp_uint_t)*4))) &&
        luint_lt(luint_from_uint(sexp_bignum_data(b1)[blen-1]), luint_shl(luint_from_uint(1), (sizeof(sexp_uint_t)*4)))) {
      dn = luint_add_uint(luint_shl(dn, (sizeof(sexp_uint_t)*4))
        , (sexp_bignum_data(a1)[alen-3] >> (sizeof(sexp_uint_t)*4)));
      dd = luint_add_uint(luint_shl(dd, (sizeof(sexp_uint_t)*4))
        , (sexp_bignum_data(b1)[blen-3] >> (sizeof(sexp_uint_t)*4)));
    }
    d = luint_div(dn, dd);
    if (luint_eq(d, luint_from_uint(0))) {
      dn = luint_add_uint(luint_shl(luint_from_uint(sexp_bignum_data(a1)[alen-1])
             , (sizeof(sexp_uint_t)*8))
            , sexp_bignum_data(a1)[alen-2]);
      dd = luint_from_uint(sexp_bignum_data(b1)[blen-1]);
      if (luint_lt(luint_from_uint(sexp_bignum_data(a1)[alen-1]), (luint_shl(luint_from_uint(1), (sizeof(sexp_uint_t)*4)))) &&
          luint_lt(luint_from_uint(sexp_bignum_data(b1)[blen-1]), (luint_shl(luint_from_uint(1), (sizeof(sexp_uint_t)*4))))) {
        dn = luint_add_uint(luint_shl(dn, (sizeof(sexp_uint_t)*4))
          , (sexp_bignum_data(a1)[alen-3] >> (sizeof(sexp_uint_t)*4)));
        dd = luint_add_uint(luint_shl(dd, (sizeof(sexp_uint_t)*4))
          , (sexp_bignum_data(b1)[blen-2] >> (sizeof(sexp_uint_t)*4)));
      }
      d = luint_div(dn, dd);
      off--;
    }
    dhi = luint_to_uint(luint_shr(d, (sizeof(sexp_uint_t)*8)));
    dlo = luint_to_uint(luint_and(d, luint_sub(luint_shl(luint_from_uint(1), (sizeof(sexp_uint_t)*8)), luint_from_uint(1))));
    sexp_bignum_data(x)[off] = dhi;
    if (off > 0) sexp_bignum_data(x)[off-1] = dlo;
    /* update quotient q and remainder a1 estimates */
    y = sexp_bignum_mul(ctx, NULL, b1, x);
    if (sign < 0) {
      a1 = sexp_bignum_add(ctx, NULL, a1, y);
      q = sexp_sub(ctx, q, x);
    } else {
      a1 = sexp_bignum_sub(ctx, NULL, a1, y);
      q = sexp_add(ctx, q, x);
    }
    /* flip the sign if we overshot in our estimate */
    if (sexp_bignum_sign(a1) != sign) {
      sexp_bignum_sign(a1) = (char)(-sign);
      sign *= -1;
    }
  }
  /* adjust signs */
  a1 = sexp_bignum_normalize(a1);
  if (sign < 0 && a1 != SEXP_ZERO) {
    q = sexp_sub(ctx, q, SEXP_ONE);
    a1 = sexp_add(ctx, a1, b1);
  }
  *rem = a1;
  if (sexp_bignum_sign(a) * sexp_bignum_sign(b) < 0) {
    sexp_negate_exact(q);
  }
  if (sexp_bignum_sign(a) < 0) {
    sexp_negate_exact(*rem);
  }
  sexp_gc_release5(ctx);
  return q;
}